

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die_deliv.c
# Opt level: O3

int dwarf_get_debugfission_for_die
              (Dwarf_Die die,Dwarf_Debug_Fission_Per_CU_s *fission_out,Dwarf_Error *error)

{
  Dwarf_Half DVar1;
  Dwarf_CU_Context_conflict pDVar2;
  Dwarf_Debug dbg;
  Dwarf_Bool DVar3;
  int iVar4;
  Dwarf_Signed errval;
  
  if (die == (Dwarf_Die)0x0) {
    errval = 0x34;
LAB_00153adf:
    _dwarf_error((Dwarf_Debug)0x0,error,errval);
    return 1;
  }
  pDVar2 = die->di_cu_context;
  if (pDVar2 == (Dwarf_CU_Context_conflict)0x0) {
    errval = 0x68;
    goto LAB_00153adf;
  }
  dbg = pDVar2->cc_dbg;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: accesing a cu context, Dwarf_Debug either null or it containsa stale Dwarf_Debug pointer"
                       );
    return 1;
  }
  DVar3 = _dwarf_file_has_debug_fission_index(dbg);
  if (DVar3 == 0) {
    return -1;
  }
  DVar1 = pDVar2->cc_unit_type;
  if (DVar1 == 6) {
LAB_00153ab1:
    iVar4 = _dwarf_file_has_debug_fission_tu_index(dbg);
  }
  else {
    if (DVar1 != 5) {
      if (DVar1 != 2) goto LAB_00153b07;
      goto LAB_00153ab1;
    }
    iVar4 = _dwarf_file_has_debug_fission_cu_index(dbg);
  }
  if (iVar4 == 0) {
    return -1;
  }
LAB_00153b07:
  if ((pDVar2->cc_dwp_offsets).pcu_type != (char *)0x0) {
    memcpy(fission_out,&pDVar2->cc_dwp_offsets,0xe8);
    return 0;
  }
  return -1;
}

Assistant:

int
dwarf_get_debugfission_for_die(Dwarf_Die die,
    struct Dwarf_Debug_Fission_Per_CU_s *fission_out,
    Dwarf_Error *error)
{
    Dwarf_CU_Context context = 0;
    Dwarf_Debug dbg = 0;
    struct Dwarf_Debug_Fission_Per_CU_s * percu = 0;

    CHECK_DIE(die, DW_DLV_ERROR);
    context = die->di_cu_context;
    dbg = context->cc_dbg;
    if (!_dwarf_file_has_debug_fission_index(dbg)) {
        return DW_DLV_NO_ENTRY;
    }

    /*  Logic should work for DW4 and DW5. */
    if (context->cc_unit_type == DW_UT_type||
        context->cc_unit_type == DW_UT_split_type ) {
        if (!_dwarf_file_has_debug_fission_tu_index(dbg)) {
            return DW_DLV_NO_ENTRY;
        }
    } else if (context->cc_unit_type == DW_UT_split_compile) {
        if (!_dwarf_file_has_debug_fission_cu_index(dbg)) {
            return DW_DLV_NO_ENTRY;
        }
    } else { /* Fall through*/ }
    percu = &context->cc_dwp_offsets;
    if (!percu->pcu_type) {
        return DW_DLV_NO_ENTRY;
    }
    *fission_out = *percu;
    return DW_DLV_OK;
}